

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_image(stbi__jpeg *j)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  uint local_1c;
  int x;
  int m;
  stbi__jpeg *j_local;
  
  for (local_1c = 0; (int)local_1c < 4; local_1c = local_1c + 1) {
    j->img_comp[(int)local_1c].raw_data = (void *)0x0;
    j->img_comp[(int)local_1c].raw_coeff = (void *)0x0;
  }
  j->restart_interval = 0;
  iVar3 = stbi__decode_jpeg_header(j,0);
  if (iVar3 == 0) {
    j_local._4_4_ = 0;
  }
  else {
    bVar1 = stbi__get_marker(j);
    while (local_1c = (uint)bVar1, local_1c != 0xd9) {
      if (local_1c == 0xda) {
        iVar3 = stbi__process_scan_header(j);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = stbi__parse_entropy_coded_data(j);
        if (iVar3 == 0) {
          return 0;
        }
        if (j->marker == 0xff) {
          while (iVar3 = stbi__at_eof(j->s), iVar3 == 0) {
            sVar2 = stbi__get8(j->s);
            if (sVar2 == 0xff) {
              sVar2 = stbi__get8(j->s);
              j->marker = sVar2;
              break;
            }
            if (sVar2 != '\0') {
              iVar3 = stbi__err("junk before marker");
              return iVar3;
            }
          }
        }
      }
      else {
        iVar3 = stbi__process_marker(j,local_1c);
        if (iVar3 == 0) {
          return 0;
        }
      }
      bVar1 = stbi__get_marker(j);
    }
    if (j->progressive != 0) {
      stbi__jpeg_finish(j);
    }
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__decode_jpeg_image(stbi__jpeg *j)
{
   int m;
   for (m = 0; m < 4; m++) {
      j->img_comp[m].raw_data = NULL;
      j->img_comp[m].raw_coeff = NULL;
   }
   j->restart_interval = 0;
   if (!stbi__decode_jpeg_header(j, STBI__SCAN_load)) return 0;
   m = stbi__get_marker(j);
   while (!stbi__EOI(m)) {
      if (stbi__SOS(m)) {
         if (!stbi__process_scan_header(j)) return 0;
         if (!stbi__parse_entropy_coded_data(j)) return 0;
         if (j->marker == STBI__MARKER_none ) {
            // handle 0s at the end of image data from IP Kamera 9060
            while (!stbi__at_eof(j->s)) {
               int x = stbi__get8(j->s);
               if (x == 255) {
                  j->marker = stbi__get8(j->s);
                  break;
               } else if (x != 0) {
                  return stbi__err("junk before marker", "Corrupt JPEG");
               }
            }
            // if we reach eof without hitting a marker, stbi__get_marker() below will fail and we'll eventually return 0
         }
      } else {
         if (!stbi__process_marker(j, m)) return 0;
      }
      m = stbi__get_marker(j);
   }
   if (j->progressive)
      stbi__jpeg_finish(j);
   return 1;
}